

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pz81_mod.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinPZ81_MOD>::eval_exc_unpolar_impl(double rho,double *eps)

{
  double *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double t80;
  double t79;
  double t74;
  double t72;
  double t70;
  double t67;
  double t51;
  double t42;
  double t34;
  double t28;
  double t24;
  double t21;
  double t15;
  double t12;
  double t11;
  double t10;
  double t9;
  double t8;
  double t7;
  double t63;
  double t59;
  double t58;
  double t54;
  double t48;
  double t44;
  double t43;
  double t38;
  double t33;
  double t32;
  double t27;
  double t20;
  double t19;
  double t14;
  double t13;
  double t6;
  double t76;
  double t5;
  double t3;
  double t1;
  
  dVar1 = safe_math::cbrt<double>(9.91007741872581e-318);
  dVar2 = (1.0 / dVar1) * 2.519842099789747;
  dVar3 = (double)(-(ulong)(1.0 <= dVar2 * 0.9847450218426962 * 0.25) & 0x3ff0000000000000);
  dVar4 = safe_math::sqrt<double>(9.91085804244624e-318);
  dVar1 = (1.0 / dVar1) * 1.720508027656199;
  dVar5 = safe_math::log<double>(9.9114212772825e-318);
  dVar2 = dVar2 * dVar5;
  dVar6 = piecewise_functor_3<double>
                    (dVar3 != 0.0,
                     -0.1423 / ((dVar4 * 1.0529) / 2.0 + 1.0 + (dVar1 * 0.4808460067404899) / 4.0),
                     dVar5 * 0.0311 + -0.048 + (dVar2 * 0.001988349821872322) / 4.0 +
                     (dVar1 * -0.016776342736774526) / 4.0);
  dVar1 = piecewise_functor_3<double>
                    (dVar3 != 0.0,
                     -0.0843 / ((dVar4 * 1.3981) / 2.0 + 1.0 + (dVar1 * 0.37657136280726433) / 4.0),
                     dVar5 * 0.01555 + -0.0269 + (dVar2 * 0.0006819863594880269) / 4.0 +
                     (dVar1 * -0.006924620274477757) / 4.0);
  dVar3 = safe_math::cbrt<double>(9.91338765855294e-318);
  dVar3 = piecewise_functor_3<double>(false,dVar3 * 1e-15,1.0);
  *in_RDI = dVar6 + (dVar1 - dVar6) * (dVar3 + dVar3 + -2.0) * 1.9236610509315362;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_unpolar_impl( double rho, double& eps ) {

    (void)(eps);
    constexpr double t1 = constants::m_cbrt_3;
    constexpr double t3 = constants::m_cbrt_one_ov_pi;
    constexpr double t5 = constants::m_cbrt_4;
    constexpr double t76 = constants::m_cbrt_2;
    constexpr double t6 = t5 * t5;
    constexpr double t13 = gamma_0;
    constexpr double t14 = beta1_0;
    constexpr double t19 = beta2_0 * t1;
    constexpr double t20 = t3 * t6;
    constexpr double t27 = a_0;
    constexpr double t32 = c_0 * t1;
    constexpr double t33 = t32 * t3;
    constexpr double t38 = d_0 * t1;
    constexpr double t43 = gamma_1;
    constexpr double t44 = beta1_1;
    constexpr double t48 = beta2_1 * t1;
    constexpr double t54 = a_1;
    constexpr double t58 = c_1 * t1;
    constexpr double t59 = t58 * t3;
    constexpr double t63 = d_1 * t1;


    const double t7 = safe_math::cbrt( rho );
    const double t8 = 0.1e1 / t7;
    const double t9 = t6 * t8;
    const double t10 = t1 * t3 * t9;
    const double t11 = t10 / 0.4e1;
    const double t12 = 0.1e1 <= t11;
    const double t15 = safe_math::sqrt( t10 );
    const double t21 = t20 * t8;
    const double t24 = 0.1e1 + t14 * t15 / 0.2e1 + t19 * t21 / 0.4e1;
    const double t28 = safe_math::log( t11 );
    const double t34 = t9 * t28;
    const double t42 = piecewise_functor_3( t12, t13 / t24, t27 * t28 + b_0 + t33 * t34 / 0.4e1 + t38 * t21 / 0.4e1 );
    const double t51 = 0.1e1 + t44 * t15 / 0.2e1 + t48 * t21 / 0.4e1;
    const double t67 = piecewise_functor_3( t12, t43 / t51, t54 * t28 + b_1 + t59 * t34 / 0.4e1 + t63 * t21 / 0.4e1 );
    const double t70 = safe_math::cbrt( zeta_tol );
    const double t72 = piecewise_functor_3( 0.1e1 <= zeta_tol, t70 * zeta_tol, 1.0 );
    const double t74 = 0.2e1 * t72 - 0.2e1;
    const double t79 = 0.1e1 / ( 0.2e1 * t76 - 0.2e1 );
    const double t80 = ( t67 - t42 ) * t74 * t79;


    eps = t42 + t80;

  }